

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  _Rb_tree_header *p_Var1;
  pointer ppFVar2;
  FileDescriptor *this_00;
  bool bVar3;
  iterator iVar4;
  int *piVar5;
  ostream *poVar6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  int j;
  int iVar10;
  string *psVar11;
  int i;
  FileOutputStream out;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  to_output;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  FileDescriptorSet file_set;
  
  FileDescriptorSet::FileDescriptorSet(&file_set);
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &already_seen._M_t._M_impl.super__Rb_tree_header._M_header;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->imports_in_descriptor_set_ == false) {
    p_Var1 = &to_output._M_t._M_impl.super__Rb_tree_header;
    to_output._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    to_output._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    to_output._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    to_output._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    to_output._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::
    _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptor_const*const*,std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>>>
              ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                *)&to_output,
               (__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                )(parsed_files->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                )(parsed_files->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
    for (uVar8 = 0;
        ppFVar2 = (parsed_files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(parsed_files->
                              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3);
        uVar8 = uVar8 + 1) {
      this_00 = ppFVar2[uVar8];
      for (iVar10 = 0; iVar10 < *(int *)(this_00 + 0x20); iVar10 = iVar10 + 1) {
        out.super_CopyingOutputStreamAdaptor.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream =
             (_func_int **)FileDescriptor::dependency(this_00,iVar10);
        iVar4 = std::
                _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::find(&to_output._M_t,(key_type *)&out);
        if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
          std::
          _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                    ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)&already_seen,(FileDescriptor **)&out);
        }
      }
    }
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Rb_tree(&to_output._M_t);
  }
  for (uVar8 = 0;
      ppFVar2 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(parsed_files->
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3);
      uVar8 = uVar8 + 1) {
    GetTransitiveDependencies
              (ppFVar2[uVar8],true,this->source_info_in_descriptor_set_,&already_seen,
               &file_set.file_);
  }
  psVar11 = &this->descriptor_set_out_name_;
  do {
    iVar10 = open((psVar11->_M_dataplus)._M_p,0x241,0x1b6);
    if (-1 < iVar10) {
      io::FileOutputStream::FileOutputStream(&out,iVar10,-1);
      io::CodedOutputStream::CodedOutputStream
                ((CodedOutputStream *)&to_output,(ZeroCopyOutputStream *)&out);
      bVar3 = MessageLite::SerializeToCodedStream
                        ((MessageLite *)&file_set,(CodedOutputStream *)&to_output);
      if (bVar3) {
        io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&to_output);
        bVar3 = io::FileOutputStream::Close(&out);
        bVar9 = true;
        if (!bVar3) {
          poVar6 = std::operator<<((ostream *)&std::cerr,(string *)psVar11);
          poVar6 = std::operator<<(poVar6,": ");
          pcVar7 = strerror(out.copying_output_.errno_);
          poVar6 = std::operator<<(poVar6,pcVar7);
          std::endl<char,std::char_traits<char>>(poVar6);
          goto LAB_0027fc32;
        }
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)psVar11);
        poVar6 = std::operator<<(poVar6,": ");
        pcVar7 = strerror(out.copying_output_.errno_);
        poVar6 = std::operator<<(poVar6,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar6);
        io::FileOutputStream::Close(&out);
        io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&to_output);
LAB_0027fc32:
        bVar9 = false;
      }
      io::FileOutputStream::~FileOutputStream(&out);
      goto LAB_0027fc3e;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  perror((psVar11->_M_dataplus)._M_p);
  bVar9 = false;
LAB_0027fc3e:
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Rb_tree(&already_seen._M_t);
  FileDescriptorSet::~FileDescriptorSet(&file_set);
  return bVar9;
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const std::vector<const FileDescriptor*>& parsed_files) {
  FileDescriptorSet file_set;

  std::set<const FileDescriptor*> already_seen;
  if (!imports_in_descriptor_set_) {
    // Since we don't want to output transitive dependencies, but we do want
    // things to be in dependency order, add all dependencies that aren't in
    // parsed_files to already_seen.  This will short circuit the recursion
    // in GetTransitiveDependencies.
    std::set<const FileDescriptor*> to_output;
    to_output.insert(parsed_files.begin(), parsed_files.end());
    for (int i = 0; i < parsed_files.size(); i++) {
      const FileDescriptor* file = parsed_files[i];
      for (int j = 0; j < file->dependency_count(); j++) {
        const FileDescriptor* dependency = file->dependency(j);
        // if the dependency isn't in parsed files, mark it as already seen
        if (to_output.find(dependency) == to_output.end()) {
          already_seen.insert(dependency);
        }
      }
    }
  }
  for (int i = 0; i < parsed_files.size(); i++) {
    GetTransitiveDependencies(parsed_files[i],
                              true,  // Include json_name
                              source_info_in_descriptor_set_, &already_seen,
                              file_set.mutable_file());
  }

  int fd;
  do {
    fd = open(descriptor_set_out_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_out_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);

  {
    io::CodedOutputStream coded_out(&out);
    // Determinism is useful here because build outputs are sometimes checked
    // into version control.
    coded_out.SetSerializationDeterministic(true);
    if (!file_set.SerializeToCodedStream(&coded_out)) {
      std::cerr << descriptor_set_out_name_ << ": " << strerror(out.GetErrno())
                << std::endl;
      out.Close();
      return false;
    }
  }

  if (!out.Close()) {
    std::cerr << descriptor_set_out_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    return false;
  }

  return true;
}